

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

void array_size_float(t_array_size *x,t_floatarg f)

{
  _array *array;
  _garray *x_00;
  int local_34;
  int n;
  _garray *y;
  _array *a;
  _glist *glist;
  t_array_size *ptStack_10;
  t_floatarg f_local;
  t_array_size *x_local;
  
  glist._4_4_ = f;
  ptStack_10 = x;
  array = array_client_getbuf(&x->x_tc,(_glist **)&a);
  if (array != (_array *)0x0) {
    if ((ptStack_10->x_tc).tc_sym == (t_symbol *)0x0) {
      local_34 = (int)glist._4_4_;
      if (local_34 < 1) {
        local_34 = 1;
      }
      array_resize_and_redraw(array,(_glist *)a,local_34);
    }
    else {
      x_00 = (_garray *)pd_findbyclass((ptStack_10->x_tc).tc_sym,garray_class);
      if (x_00 == (_garray *)0x0) {
        pd_error(ptStack_10,"no such array \'%s\'",((ptStack_10->x_tc).tc_sym)->s_name);
      }
      else {
        garray_resize(x_00,glist._4_4_);
      }
    }
  }
  return;
}

Assistant:

static void array_size_float(t_array_size *x, t_floatarg f)
{
    t_glist *glist;
    t_array *a = array_client_getbuf(&x->x_tc, &glist);
    if (a)
    {
              /* if it's a named array object we have to go back and find the
              garray (repeating work done in array_client_getbuf()) because
              the garray might want to adjust.  Maybe array_client_getbuf
              should have a return slot for the garray if any?  */
        if (x->x_tc.tc_sym)
        {
            t_garray *y = (t_garray *)pd_findbyclass(x->x_tc.tc_sym,
                garray_class);
            if (!y)
            {
                pd_error(x, "no such array '%s'", x->x_tc.tc_sym->s_name);
                return;
            }
            garray_resize(y, f);
        }
        else
        {
            int n = f;
            if (n < 1)
                n = 1;
             array_resize_and_redraw(a, glist, n);
        }
    }
}